

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_newton.c
# Opt level: O0

int SUNNonlinSolSetPrintLevel_Newton(SUNNonlinearSolver NLS,int print_level)

{
  int print_level_local;
  SUNNonlinearSolver NLS_local;
  int local_4;
  
  if (NLS == (SUNNonlinearSolver)0x0) {
    local_4 = -0x385;
  }
  else if ((print_level < 0) || (1 < print_level)) {
    local_4 = -0x387;
  }
  else {
    *(int *)((long)NLS->content + 0x50) = print_level;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int SUNNonlinSolSetPrintLevel_Newton(SUNNonlinearSolver NLS,
                                     int print_level)
{
  /* check that the nonlinear solver is non-null */
  if (NLS == NULL)
    return(SUN_NLS_MEM_NULL);

  /* check for valid print level */
  if (print_level < 0 || print_level > 1)
    return(SUN_NLS_ILL_INPUT);

  NEWTON_CONTENT(NLS)->print_level = print_level;

  return(SUN_NLS_SUCCESS);
}